

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

uint implementations::scheme::do_scheme_complete_test(void)

{
  environment *this;
  ostream *poVar1;
  size_t __nbytes;
  cell *exp;
  size_t __nbytes_00;
  cell *exp_00;
  size_t __nbytes_01;
  cell *exp_01;
  size_t __nbytes_02;
  cell *exp_02;
  size_t __nbytes_03;
  cell *exp_03;
  size_t __nbytes_04;
  cell *exp_04;
  size_t __nbytes_05;
  cell *exp_05;
  size_t __nbytes_06;
  cell *exp_06;
  size_t __nbytes_07;
  cell *exp_07;
  size_t __nbytes_08;
  cell *exp_08;
  size_t __nbytes_09;
  cell *exp_09;
  size_t __nbytes_10;
  cell *exp_10;
  size_t __nbytes_11;
  cell *exp_11;
  size_t __nbytes_12;
  cell *exp_12;
  size_t __nbytes_13;
  cell *exp_13;
  size_t __nbytes_14;
  cell *exp_14;
  size_t __nbytes_15;
  cell *exp_15;
  size_t __nbytes_16;
  cell *exp_16;
  size_t __nbytes_17;
  cell *exp_17;
  size_t __nbytes_18;
  cell *exp_18;
  size_t __nbytes_19;
  cell *exp_19;
  size_t __nbytes_20;
  cell *exp_20;
  size_t __nbytes_21;
  cell *exp_21;
  size_t __nbytes_22;
  cell *exp_22;
  size_t __nbytes_23;
  cell *exp_23;
  size_t __nbytes_24;
  cell *exp_24;
  size_t __nbytes_25;
  cell *exp_25;
  size_t __nbytes_26;
  cell *exp_26;
  size_t __nbytes_27;
  cell *exp_27;
  bool bVar2;
  shared_ptr<implementations::scheme::environment> local_22b8;
  allocator local_22a1;
  string local_22a0 [32];
  cell local_2280;
  cell local_2228;
  string local_21d0;
  allocator local_21a9;
  string local_21a8;
  shared_ptr<implementations::scheme::environment> local_2188;
  allocator local_2171;
  string local_2170 [32];
  cell local_2150;
  cell local_20f8;
  string local_20a0;
  allocator local_2079;
  string local_2078;
  shared_ptr<implementations::scheme::environment> local_2058;
  allocator local_2041;
  string local_2040 [32];
  cell local_2020;
  cell local_1fc8;
  string local_1f70;
  allocator local_1f49;
  string local_1f48;
  shared_ptr<implementations::scheme::environment> local_1f28;
  allocator local_1f11;
  string local_1f10 [32];
  cell local_1ef0;
  cell local_1e98;
  string local_1e40;
  allocator local_1e19;
  string local_1e18;
  shared_ptr<implementations::scheme::environment> local_1df8;
  allocator local_1de1;
  string local_1de0 [32];
  cell local_1dc0;
  cell local_1d68;
  string local_1d10;
  allocator local_1ce9;
  string local_1ce8;
  shared_ptr<implementations::scheme::environment> local_1cc8;
  allocator local_1cb1;
  string local_1cb0 [32];
  cell local_1c90;
  cell local_1c38;
  string local_1be0;
  allocator local_1bb9;
  string local_1bb8;
  shared_ptr<implementations::scheme::environment> local_1b98;
  allocator local_1b81;
  string local_1b80 [32];
  cell local_1b60;
  cell local_1b08;
  string local_1ab0;
  allocator local_1a89;
  string local_1a88;
  shared_ptr<implementations::scheme::environment> local_1a68;
  allocator local_1a51;
  string local_1a50 [32];
  cell local_1a30;
  cell local_19d8;
  string local_1980;
  allocator local_1959;
  string local_1958;
  shared_ptr<implementations::scheme::environment> local_1938;
  allocator local_1921;
  string local_1920 [32];
  cell local_1900;
  cell local_18a8;
  string local_1850;
  allocator local_1829;
  string local_1828;
  shared_ptr<implementations::scheme::environment> local_1808;
  allocator local_17f1;
  string local_17f0 [32];
  cell local_17d0;
  cell local_1778;
  string local_1720;
  allocator local_16f9;
  string local_16f8;
  shared_ptr<implementations::scheme::environment> local_16d8;
  allocator local_16c1;
  string local_16c0 [32];
  cell local_16a0;
  cell local_1648;
  string local_15f0;
  allocator local_15c9;
  string local_15c8;
  shared_ptr<implementations::scheme::environment> local_15a8;
  allocator local_1591;
  string local_1590 [32];
  cell local_1570;
  cell local_1518;
  string local_14c0;
  allocator local_1499;
  string local_1498;
  shared_ptr<implementations::scheme::environment> local_1478;
  allocator local_1461;
  string local_1460 [32];
  cell local_1440;
  cell local_13e8;
  string local_1390;
  allocator local_1369;
  string local_1368;
  shared_ptr<implementations::scheme::environment> local_1348;
  allocator local_1331;
  string local_1330 [32];
  cell local_1310;
  cell local_12b8;
  string local_1260;
  allocator local_1239;
  string local_1238;
  shared_ptr<implementations::scheme::environment> local_1218;
  allocator local_1201;
  string local_1200 [32];
  cell local_11e0;
  cell local_1188;
  string local_1130;
  allocator local_1109;
  string local_1108;
  shared_ptr<implementations::scheme::environment> local_10e8;
  allocator local_10d1;
  string local_10d0 [32];
  cell local_10b0;
  cell local_1058;
  string local_1000;
  allocator local_fd9;
  string local_fd8;
  shared_ptr<implementations::scheme::environment> local_fb8;
  allocator local_fa1;
  string local_fa0 [32];
  cell local_f80;
  cell local_f28;
  string local_ed0;
  allocator local_ea9;
  string local_ea8;
  shared_ptr<implementations::scheme::environment> local_e88;
  allocator local_e71;
  string local_e70 [32];
  cell local_e50;
  cell local_df8;
  string local_da0;
  allocator local_d79;
  string local_d78;
  shared_ptr<implementations::scheme::environment> local_d58;
  allocator local_d41;
  string local_d40 [32];
  cell local_d20;
  cell local_cc8;
  string local_c70;
  allocator local_c49;
  string local_c48;
  shared_ptr<implementations::scheme::environment> local_c28;
  allocator local_c11;
  string local_c10 [32];
  cell local_bf0;
  cell local_b98;
  string local_b40;
  allocator local_b19;
  string local_b18;
  shared_ptr<implementations::scheme::environment> local_af8;
  allocator local_ae1;
  string local_ae0 [32];
  cell local_ac0;
  cell local_a68;
  string local_a10;
  allocator local_9e9;
  string local_9e8;
  shared_ptr<implementations::scheme::environment> local_9c8;
  allocator local_9b1;
  string local_9b0 [32];
  cell local_990;
  cell local_938;
  string local_8e0;
  allocator local_8b9;
  string local_8b8;
  shared_ptr<implementations::scheme::environment> local_898;
  allocator local_881;
  string local_880 [32];
  cell local_860;
  cell local_808;
  string local_7b0;
  allocator local_789;
  string local_788;
  shared_ptr<implementations::scheme::environment> local_768;
  allocator local_751;
  string local_750 [32];
  cell local_730;
  cell local_6d8;
  string local_680;
  allocator local_659;
  string local_658;
  shared_ptr<implementations::scheme::environment> local_638;
  allocator local_621;
  string local_620 [32];
  cell local_600;
  cell local_5a8;
  string local_550;
  allocator local_529;
  string local_528;
  shared_ptr<implementations::scheme::environment> local_508;
  allocator local_4f1;
  string local_4f0 [32];
  cell local_4d0;
  cell local_478;
  string local_420;
  allocator local_3f9;
  string local_3f8;
  shared_ptr<implementations::scheme::environment> local_3d8;
  allocator local_3c1;
  string local_3c0 [32];
  cell local_3a0;
  cell local_348;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  shared_ptr<implementations::scheme::environment> local_2a8;
  allocator local_291;
  string local_290 [32];
  cell local_270;
  cell local_218;
  string local_1c0;
  allocator local_199;
  string local_198;
  shared_ptr<implementations::scheme::environment> local_178;
  allocator local_161;
  string local_160 [32];
  cell local_140;
  cell local_e8;
  string local_90;
  allocator local_69;
  string local_68;
  shared_ptr<implementations::scheme::environment> local_48;
  undefined1 local_35;
  shared_ptr<implementations::scheme::environment> local_28;
  undefined1 local_18 [8];
  env_p global_env;
  
  this = (environment *)operator_new(0x98);
  local_35 = 1;
  std::shared_ptr<implementations::scheme::environment>::shared_ptr(&local_28,(nullptr_t)0x0);
  environment::environment(this,&local_28);
  local_35 = 0;
  std::shared_ptr<implementations::scheme::environment>::
  shared_ptr<implementations::scheme::environment,void>
            ((shared_ptr<implementations::scheme::environment> *)local_18,this);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_28);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_48,(shared_ptr<implementations::scheme::environment> *)local_18);
  add_globals(&local_48);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"(quote (testing 1 (2.0) -3.14e159))",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"(quote (testing 1 (2.0) -3.14e159))",&local_161);
  read((int)&local_140,local_160,__nbytes);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_178,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_e8,&local_140,&local_178);
  to_string_abi_cxx11_(&local_90,(scheme *)&local_e8,exp);
  test_equal_<std::__cxx11::string,char[28]>
            (&local_68,&local_90,(char (*) [28])"(testing 1 (2.0) -3.14e159)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x31e);
  std::__cxx11::string::~string((string *)&local_90);
  cell::~cell(&local_e8);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_178);
  cell::~cell(&local_140);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"(+ 2 2)",&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"(+ 2 2)",&local_291);
  read((int)&local_270,local_290,__nbytes_00);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_2a8,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_218,&local_270,&local_2a8);
  to_string_abi_cxx11_(&local_1c0,(scheme *)&local_218,exp_00);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_198,&local_1c0,(char (*) [2])"4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,799);
  std::__cxx11::string::~string((string *)&local_1c0);
  cell::~cell(&local_218);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_2a8);
  cell::~cell(&local_270);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"(+ (* 2 100) (* 1 10))",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"(+ (* 2 100) (* 1 10))",&local_3c1);
  read((int)&local_3a0,local_3c0,__nbytes_01);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_3d8,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_348,&local_3a0,&local_3d8);
  to_string_abi_cxx11_(&local_2f0,(scheme *)&local_348,exp_01);
  test_equal_<std::__cxx11::string,char[4]>
            (&local_2c8,&local_2f0,(char (*) [4])"210",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,800);
  std::__cxx11::string::~string((string *)&local_2f0);
  cell::~cell(&local_348);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_3d8);
  cell::~cell(&local_3a0);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f8,"(if (> 6 5) (+ 1 1) (+ 2 2))",&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"(if (> 6 5) (+ 1 1) (+ 2 2))",&local_4f1);
  read((int)&local_4d0,local_4f0,__nbytes_02);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_508,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_478,&local_4d0,&local_508);
  to_string_abi_cxx11_(&local_420,(scheme *)&local_478,exp_02);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_3f8,&local_420,(char (*) [2])0x162bf5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x321);
  std::__cxx11::string::~string((string *)&local_420);
  cell::~cell(&local_478);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_508);
  cell::~cell(&local_4d0);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_528,"(if (< 6 5) (+ 1 1) (+ 2 2))",&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_620,"(if (< 6 5) (+ 1 1) (+ 2 2))",&local_621);
  read((int)&local_600,local_620,__nbytes_03);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_638,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_5a8,&local_600,&local_638);
  to_string_abi_cxx11_(&local_550,(scheme *)&local_5a8,exp_03);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_528,&local_550,(char (*) [2])"4",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x322);
  std::__cxx11::string::~string((string *)&local_550);
  cell::~cell(&local_5a8);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_638);
  cell::~cell(&local_600);
  std::__cxx11::string::~string(local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_658,"(define x 3)",&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_750,"(define x 3)",&local_751);
  read((int)&local_730,local_750,__nbytes_04);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_768,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_6d8,&local_730,&local_768);
  to_string_abi_cxx11_(&local_680,(scheme *)&local_6d8,exp_04);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_658,&local_680,(char (*) [2])"3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x323);
  std::__cxx11::string::~string((string *)&local_680);
  cell::~cell(&local_6d8);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_768);
  cell::~cell(&local_730);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_788,"x",&local_789);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_880,"x",&local_881);
  read((int)&local_860,local_880,__nbytes_05);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_898,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_808,&local_860,&local_898);
  to_string_abi_cxx11_(&local_7b0,(scheme *)&local_808,exp_05);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_788,&local_7b0,(char (*) [2])"3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x324);
  std::__cxx11::string::~string((string *)&local_7b0);
  cell::~cell(&local_808);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_898);
  cell::~cell(&local_860);
  std::__cxx11::string::~string(local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator((allocator<char> *)&local_789);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8b8,"(+ x x)",&local_8b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9b0,"(+ x x)",&local_9b1);
  read((int)&local_990,local_9b0,__nbytes_06);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_9c8,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_938,&local_990,&local_9c8);
  to_string_abi_cxx11_(&local_8e0,(scheme *)&local_938,exp_06);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_8b8,&local_8e0,(char (*) [2])"6",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x325);
  std::__cxx11::string::~string((string *)&local_8e0);
  cell::~cell(&local_938);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_9c8);
  cell::~cell(&local_990);
  std::__cxx11::string::~string(local_9b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9e8,"(begin (define x 1) (set! x (+ x 1)) (+ x 1))",&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae0,"(begin (define x 1) (set! x (+ x 1)) (+ x 1))",&local_ae1)
  ;
  read((int)&local_ac0,local_ae0,__nbytes_07);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_af8,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_a68,&local_ac0,&local_af8);
  to_string_abi_cxx11_(&local_a10,(scheme *)&local_a68,exp_07);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_9e8,&local_a10,(char (*) [2])"3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x326);
  std::__cxx11::string::~string((string *)&local_a10);
  cell::~cell(&local_a68);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_af8);
  cell::~cell(&local_ac0);
  std::__cxx11::string::~string(local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b18,"((lambda (x) (+ x x)) 5)",&local_b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c10,"((lambda (x) (+ x x)) 5)",&local_c11);
  read((int)&local_bf0,local_c10,__nbytes_08);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_c28,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_b98,&local_bf0,&local_c28);
  to_string_abi_cxx11_(&local_b40,(scheme *)&local_b98,exp_08);
  test_equal_<std::__cxx11::string,char[3]>
            (&local_b18,&local_b40,(char (*) [3])0x1631a7,
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x327);
  std::__cxx11::string::~string((string *)&local_b40);
  cell::~cell(&local_b98);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_c28);
  cell::~cell(&local_bf0);
  std::__cxx11::string::~string(local_c10);
  std::allocator<char>::~allocator((allocator<char> *)&local_c11);
  std::__cxx11::string::~string((string *)&local_b18);
  std::allocator<char>::~allocator((allocator<char> *)&local_b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c48,"(define twice (lambda (x) (* 2 x)))",&local_c49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d40,"(define twice (lambda (x) (* 2 x)))",&local_d41);
  read((int)&local_d20,local_d40,__nbytes_09);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_d58,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_cc8,&local_d20,&local_d58);
  to_string_abi_cxx11_(&local_c70,(scheme *)&local_cc8,exp_09);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_c48,&local_c70,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x328);
  std::__cxx11::string::~string((string *)&local_c70);
  cell::~cell(&local_cc8);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_d58);
  cell::~cell(&local_d20);
  std::__cxx11::string::~string(local_d40);
  std::allocator<char>::~allocator((allocator<char> *)&local_d41);
  std::__cxx11::string::~string((string *)&local_c48);
  std::allocator<char>::~allocator((allocator<char> *)&local_c49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d78,"(twice 5)",&local_d79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e70,"(twice 5)",&local_e71);
  read((int)&local_e50,local_e70,__nbytes_10);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_e88,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_df8,&local_e50,&local_e88);
  to_string_abi_cxx11_(&local_da0,(scheme *)&local_df8,exp_10);
  test_equal_<std::__cxx11::string,char[3]>
            (&local_d78,&local_da0,(char (*) [3])0x1631a7,
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x329);
  std::__cxx11::string::~string((string *)&local_da0);
  cell::~cell(&local_df8);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_e88);
  cell::~cell(&local_e50);
  std::__cxx11::string::~string(local_e70);
  std::allocator<char>::~allocator((allocator<char> *)&local_e71);
  std::__cxx11::string::~string((string *)&local_d78);
  std::allocator<char>::~allocator((allocator<char> *)&local_d79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ea8,"(define compose (lambda (f g) (lambda (x) (f (g x)))))",
             &local_ea9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_fa0,"(define compose (lambda (f g) (lambda (x) (f (g x)))))",&local_fa1);
  read((int)&local_f80,local_fa0,__nbytes_11);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_fb8,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_f28,&local_f80,&local_fb8);
  to_string_abi_cxx11_(&local_ed0,(scheme *)&local_f28,exp_11);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_ea8,&local_ed0,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32a);
  std::__cxx11::string::~string((string *)&local_ed0);
  cell::~cell(&local_f28);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_fb8);
  cell::~cell(&local_f80);
  std::__cxx11::string::~string(local_fa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
  std::__cxx11::string::~string((string *)&local_ea8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ea9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fd8,"((compose list twice) 5)",&local_fd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10d0,"((compose list twice) 5)",&local_10d1);
  read((int)&local_10b0,local_10d0,__nbytes_12);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_10e8,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_1058,&local_10b0,&local_10e8);
  to_string_abi_cxx11_(&local_1000,(scheme *)&local_1058,exp_12);
  test_equal_<std::__cxx11::string,char[5]>
            (&local_fd8,&local_1000,(char (*) [5])"(10)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32b);
  std::__cxx11::string::~string((string *)&local_1000);
  cell::~cell(&local_1058);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_10e8);
  cell::~cell(&local_10b0);
  std::__cxx11::string::~string(local_10d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10d1);
  std::__cxx11::string::~string((string *)&local_fd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1108,"(define repeat (lambda (f) (compose f f)))",&local_1109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1200,"(define repeat (lambda (f) (compose f f)))",&local_1201);
  read((int)&local_11e0,local_1200,__nbytes_13);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_1218,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_1188,&local_11e0,&local_1218);
  to_string_abi_cxx11_(&local_1130,(scheme *)&local_1188,exp_13);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_1108,&local_1130,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32c);
  std::__cxx11::string::~string((string *)&local_1130);
  cell::~cell(&local_1188);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_1218);
  cell::~cell(&local_11e0);
  std::__cxx11::string::~string(local_1200);
  std::allocator<char>::~allocator((allocator<char> *)&local_1201);
  std::__cxx11::string::~string((string *)&local_1108);
  std::allocator<char>::~allocator((allocator<char> *)&local_1109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1238,"((repeat twice) 5)",&local_1239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1330,"((repeat twice) 5)",&local_1331);
  read((int)&local_1310,local_1330,__nbytes_14);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_1348,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_12b8,&local_1310,&local_1348);
  to_string_abi_cxx11_(&local_1260,(scheme *)&local_12b8,exp_14);
  test_equal_<std::__cxx11::string,char[3]>
            (&local_1238,&local_1260,(char (*) [3])"20",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32d);
  std::__cxx11::string::~string((string *)&local_1260);
  cell::~cell(&local_12b8);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_1348);
  cell::~cell(&local_1310);
  std::__cxx11::string::~string(local_1330);
  std::allocator<char>::~allocator((allocator<char> *)&local_1331);
  std::__cxx11::string::~string((string *)&local_1238);
  std::allocator<char>::~allocator((allocator<char> *)&local_1239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1368,"((repeat (repeat twice)) 5)",&local_1369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1460,"((repeat (repeat twice)) 5)",&local_1461);
  read((int)&local_1440,local_1460,__nbytes_15);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_1478,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_13e8,&local_1440,&local_1478);
  to_string_abi_cxx11_(&local_1390,(scheme *)&local_13e8,exp_15);
  test_equal_<std::__cxx11::string,char[3]>
            (&local_1368,&local_1390,(char (*) [3])"80",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32e);
  std::__cxx11::string::~string((string *)&local_1390);
  cell::~cell(&local_13e8);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_1478);
  cell::~cell(&local_1440);
  std::__cxx11::string::~string(local_1460);
  std::allocator<char>::~allocator((allocator<char> *)&local_1461);
  std::__cxx11::string::~string((string *)&local_1368);
  std::allocator<char>::~allocator((allocator<char> *)&local_1369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1498,"(define fact (lambda (n) (if (<= n 1) 1 (* n (fact (- n 1))))))"
             ,&local_1499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1590,"(define fact (lambda (n) (if (<= n 1) 1 (* n (fact (- n 1))))))",
             &local_1591);
  read((int)&local_1570,local_1590,__nbytes_16);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_15a8,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_1518,&local_1570,&local_15a8);
  to_string_abi_cxx11_(&local_14c0,(scheme *)&local_1518,exp_16);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_1498,&local_14c0,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x32f);
  std::__cxx11::string::~string((string *)&local_14c0);
  cell::~cell(&local_1518);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_15a8);
  cell::~cell(&local_1570);
  std::__cxx11::string::~string(local_1590);
  std::allocator<char>::~allocator((allocator<char> *)&local_1591);
  std::__cxx11::string::~string((string *)&local_1498);
  std::allocator<char>::~allocator((allocator<char> *)&local_1499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_15c8,"(fact 3)",&local_15c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16c0,"(fact 3)",&local_16c1);
  read((int)&local_16a0,local_16c0,__nbytes_17);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_16d8,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_1648,&local_16a0,&local_16d8);
  to_string_abi_cxx11_(&local_15f0,(scheme *)&local_1648,exp_17);
  test_equal_<std::__cxx11::string,char[2]>
            (&local_15c8,&local_15f0,(char (*) [2])"6",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x330);
  std::__cxx11::string::~string((string *)&local_15f0);
  cell::~cell(&local_1648);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_16d8);
  cell::~cell(&local_16a0);
  std::__cxx11::string::~string(local_16c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16c1);
  std::__cxx11::string::~string((string *)&local_15c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_16f8,"(fact 12)",&local_16f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17f0,"(fact 12)",&local_17f1);
  read((int)&local_17d0,local_17f0,__nbytes_18);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_1808,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_1778,&local_17d0,&local_1808);
  to_string_abi_cxx11_(&local_1720,(scheme *)&local_1778,exp_18);
  test_equal_<std::__cxx11::string,char[10]>
            (&local_16f8,&local_1720,(char (*) [10])"479001600",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x332);
  std::__cxx11::string::~string((string *)&local_1720);
  cell::~cell(&local_1778);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_1808);
  cell::~cell(&local_17d0);
  std::__cxx11::string::~string(local_17f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17f1);
  std::__cxx11::string::~string((string *)&local_16f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1828,"(define abs (lambda (n) ((if (> n 0) + -) 0 n)))",&local_1829);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1920,"(define abs (lambda (n) ((if (> n 0) + -) 0 n)))",&local_1921);
  read((int)&local_1900,local_1920,__nbytes_19);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_1938,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_18a8,&local_1900,&local_1938);
  to_string_abi_cxx11_(&local_1850,(scheme *)&local_18a8,exp_19);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_1828,&local_1850,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x333);
  std::__cxx11::string::~string((string *)&local_1850);
  cell::~cell(&local_18a8);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_1938);
  cell::~cell(&local_1900);
  std::__cxx11::string::~string(local_1920);
  std::allocator<char>::~allocator((allocator<char> *)&local_1921);
  std::__cxx11::string::~string((string *)&local_1828);
  std::allocator<char>::~allocator((allocator<char> *)&local_1829);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1958,"(list (abs -3) (abs 0) (abs 3))",&local_1959);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a50,"(list (abs -3) (abs 0) (abs 3))",&local_1a51);
  read((int)&local_1a30,local_1a50,__nbytes_20);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_1a68,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_19d8,&local_1a30,&local_1a68);
  to_string_abi_cxx11_(&local_1980,(scheme *)&local_19d8,exp_20);
  test_equal_<std::__cxx11::string,char[8]>
            (&local_1958,&local_1980,(char (*) [8])"(3 0 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x334);
  std::__cxx11::string::~string((string *)&local_1980);
  cell::~cell(&local_19d8);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_1a68);
  cell::~cell(&local_1a30);
  std::__cxx11::string::~string(local_1a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a51);
  std::__cxx11::string::~string((string *)&local_1958);
  std::allocator<char>::~allocator((allocator<char> *)&local_1959);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a88,
             "(define combine (lambda (f)(lambda (x y)(if (null? x) (quote ())(f (list (head x) (head y))((combine f) (tail x) (tail y)))))))"
             ,&local_1a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b80,
             "(define combine (lambda (f)(lambda (x y)(if (null? x) (quote ())(f (list (head x) (head y))((combine f) (tail x) (tail y)))))))"
             ,&local_1b81);
  read((int)&local_1b60,local_1b80,__nbytes_21);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_1b98,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_1b08,&local_1b60,&local_1b98);
  to_string_abi_cxx11_(&local_1ab0,(scheme *)&local_1b08,exp_21);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_1a88,&local_1ab0,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x33b);
  std::__cxx11::string::~string((string *)&local_1ab0);
  cell::~cell(&local_1b08);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_1b98);
  cell::~cell(&local_1b60);
  std::__cxx11::string::~string(local_1b80);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b81);
  std::__cxx11::string::~string((string *)&local_1a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1bb8,"(define zip (combine cons))",&local_1bb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1cb0,"(define zip (combine cons))",&local_1cb1);
  read((int)&local_1c90,local_1cb0,__nbytes_22);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_1cc8,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_1c38,&local_1c90,&local_1cc8);
  to_string_abi_cxx11_(&local_1be0,(scheme *)&local_1c38,exp_22);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_1bb8,&local_1be0,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x33c);
  std::__cxx11::string::~string((string *)&local_1be0);
  cell::~cell(&local_1c38);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_1cc8);
  cell::~cell(&local_1c90);
  std::__cxx11::string::~string(local_1cb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cb1);
  std::__cxx11::string::~string((string *)&local_1bb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1ce8,"(zip (list 1 2 3 4) (list 5 6 7 8))",&local_1ce9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1de0,"(zip (list 1 2 3 4) (list 5 6 7 8))",&local_1de1);
  read((int)&local_1dc0,local_1de0,__nbytes_23);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_1df8,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_1d68,&local_1dc0,&local_1df8);
  to_string_abi_cxx11_(&local_1d10,(scheme *)&local_1d68,exp_23);
  test_equal_<std::__cxx11::string,char[26]>
            (&local_1ce8,&local_1d10,(char (*) [26])"((1 5) (2 6) (3 7) (4 8))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x33d);
  std::__cxx11::string::~string((string *)&local_1d10);
  cell::~cell(&local_1d68);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_1df8);
  cell::~cell(&local_1dc0);
  std::__cxx11::string::~string(local_1de0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1de1);
  std::__cxx11::string::~string((string *)&local_1ce8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ce9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e18,
             "(define riff-shuffle (lambda (deck) (begin(define take (lambda (n seq) (if (<= n 0) (quote ()) (cons (head seq) (take (- n 1) (tail seq))))))(define drop (lambda (n seq) (if (<= n 0) seq (drop (- n 1) (tail seq)))))(define mid (lambda (seq) (/ (length seq) 2)))((combine append) (take (mid deck) deck) (drop (mid deck) deck)))))"
             ,&local_1e19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f10,
             "(define riff-shuffle (lambda (deck) (begin(define take (lambda (n seq) (if (<= n 0) (quote ()) (cons (head seq) (take (- n 1) (tail seq))))))(define drop (lambda (n seq) (if (<= n 0) seq (drop (- n 1) (tail seq)))))(define mid (lambda (seq) (/ (length seq) 2)))((combine append) (take (mid deck) deck) (drop (mid deck) deck)))))"
             ,&local_1f11);
  read((int)&local_1ef0,local_1f10,__nbytes_24);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_1f28,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_1e98,&local_1ef0,&local_1f28);
  to_string_abi_cxx11_(&local_1e40,(scheme *)&local_1e98,exp_24);
  test_equal_<std::__cxx11::string,char[9]>
            (&local_1e18,&local_1e40,(char (*) [9])"<Lambda>",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x342);
  std::__cxx11::string::~string((string *)&local_1e40);
  cell::~cell(&local_1e98);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_1f28);
  cell::~cell(&local_1ef0);
  std::__cxx11::string::~string(local_1f10);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f11);
  std::__cxx11::string::~string((string *)&local_1e18);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f48,"(riff-shuffle (list 1 2 3 4 5 6 7 8))",&local_1f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2040,"(riff-shuffle (list 1 2 3 4 5 6 7 8))",&local_2041);
  read((int)&local_2020,local_2040,__nbytes_25);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_2058,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_1fc8,&local_2020,&local_2058);
  to_string_abi_cxx11_(&local_1f70,(scheme *)&local_1fc8,exp_25);
  test_equal_<std::__cxx11::string,char[18]>
            (&local_1f48,&local_1f70,(char (*) [18])"(1 5 2 6 3 7 4 8)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x343);
  std::__cxx11::string::~string((string *)&local_1f70);
  cell::~cell(&local_1fc8);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_2058);
  cell::~cell(&local_2020);
  std::__cxx11::string::~string(local_2040);
  std::allocator<char>::~allocator((allocator<char> *)&local_2041);
  std::__cxx11::string::~string((string *)&local_1f48);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2078,"((repeat riff-shuffle) (list 1 2 3 4 5 6 7 8))",&local_2079);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2170,"((repeat riff-shuffle) (list 1 2 3 4 5 6 7 8))",&local_2171);
  read((int)&local_2150,local_2170,__nbytes_26);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_2188,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_20f8,&local_2150,&local_2188);
  to_string_abi_cxx11_(&local_20a0,(scheme *)&local_20f8,exp_26);
  test_equal_<std::__cxx11::string,char[18]>
            (&local_2078,&local_20a0,(char (*) [18])"(1 3 5 7 2 4 6 8)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x344);
  std::__cxx11::string::~string((string *)&local_20a0);
  cell::~cell(&local_20f8);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_2188);
  cell::~cell(&local_2150);
  std::__cxx11::string::~string(local_2170);
  std::allocator<char>::~allocator((allocator<char> *)&local_2171);
  std::__cxx11::string::~string((string *)&local_2078);
  std::allocator<char>::~allocator((allocator<char> *)&local_2079);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_21a8,
             "(riff-shuffle (riff-shuffle (riff-shuffle (list 1 2 3 4 5 6 7 8))))",&local_21a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_22a0,"(riff-shuffle (riff-shuffle (riff-shuffle (list 1 2 3 4 5 6 7 8))))",
             &local_22a1);
  read((int)&local_2280,local_22a0,__nbytes_27);
  std::shared_ptr<implementations::scheme::environment>::shared_ptr
            (&local_22b8,(shared_ptr<implementations::scheme::environment> *)local_18);
  eval(&local_2228,&local_2280,&local_22b8);
  to_string_abi_cxx11_(&local_21d0,(scheme *)&local_2228,exp_27);
  test_equal_<std::__cxx11::string,char[18]>
            (&local_21a8,&local_21d0,(char (*) [18])"(1 2 3 4 5 6 7 8)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/andrakis[P]Stackless/Stackless/samples/Scheme.cpp"
             ,0x345);
  std::__cxx11::string::~string((string *)&local_21d0);
  cell::~cell(&local_2228);
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr(&local_22b8);
  cell::~cell(&local_2280);
  std::__cxx11::string::~string(local_22a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_22a1);
  std::__cxx11::string::~string((string *)&local_21a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_21a9);
  poVar1 = std::operator<<((ostream *)&std::cout,"total tests ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,g_test_count);
  poVar1 = std::operator<<(poVar1,", total failures ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,g_fault_count);
  std::operator<<(poVar1,"\n");
  bVar2 = g_fault_count != 0;
  std::shared_ptr<implementations::scheme::environment>::~shared_ptr
            ((shared_ptr<implementations::scheme::environment> *)local_18);
  return (uint)bVar2;
}

Assistant:

unsigned do_scheme_complete_test() {
	env_p global_env(new environment()); add_globals(global_env);
	// the 29 unit tests for lis.py
	TEST("(quote (testing 1 (2.0) -3.14e159))", "(testing 1 (2.0) -3.14e159)");
	TEST("(+ 2 2)", "4");
	TEST("(+ (* 2 100) (* 1 10))", "210");
	TEST("(if (> 6 5) (+ 1 1) (+ 2 2))", "2");
	TEST("(if (< 6 5) (+ 1 1) (+ 2 2))", "4");
	TEST("(define x 3)", "3");
	TEST("x", "3");
	TEST("(+ x x)", "6");
	TEST("(begin (define x 1) (set! x (+ x 1)) (+ x 1))", "3");
	TEST("((lambda (x) (+ x x)) 5)", "10");
	TEST("(define twice (lambda (x) (* 2 x)))", "<Lambda>");
	TEST("(twice 5)", "10");
	TEST("(define compose (lambda (f g) (lambda (x) (f (g x)))))", "<Lambda>");
	TEST("((compose list twice) 5)", "(10)");
	TEST("(define repeat (lambda (f) (compose f f)))", "<Lambda>");
	TEST("((repeat twice) 5)", "20");
	TEST("((repeat (repeat twice)) 5)", "80");
	TEST("(define fact (lambda (n) (if (<= n 1) 1 (* n (fact (- n 1))))))", "<Lambda>");
	TEST("(fact 3)", "6");
	//TEST("(fact 50)", "30414093201713378043612608166064768844377641568960512000000000000");
	TEST("(fact 12)", "479001600"); // no bignums; this is as far as we go with 32 bits
	TEST("(define abs (lambda (n) ((if (> n 0) + -) 0 n)))", "<Lambda>");
	TEST("(list (abs -3) (abs 0) (abs 3))", "(3 0 3)");
	//TEST("(define x (lambda (n) (+ n 1)))", "<Lambda>");
	//TEST("(list (x 4) (x 4) (x 4))", "(5 5 5)");
	TEST("(define combine (lambda (f)"
		"(lambda (x y)"
		"(if (null? x) (quote ())"
		"(f (list (head x) (head y))"
		"((combine f) (tail x) (tail y)))))))", "<Lambda>");
	TEST("(define zip (combine cons))", "<Lambda>");
	TEST("(zip (list 1 2 3 4) (list 5 6 7 8))", "((1 5) (2 6) (3 7) (4 8))");
	TEST("(define riff-shuffle (lambda (deck) (begin"
		"(define take (lambda (n seq) (if (<= n 0) (quote ()) (cons (head seq) (take (- n 1) (tail seq))))))"
		"(define drop (lambda (n seq) (if (<= n 0) seq (drop (- n 1) (tail seq)))))"
		"(define mid (lambda (seq) (/ (length seq) 2)))"
		"((combine append) (take (mid deck) deck) (drop (mid deck) deck)))))", "<Lambda>");
	TEST("(riff-shuffle (list 1 2 3 4 5 6 7 8))", "(1 5 2 6 3 7 4 8)");
	TEST("((repeat riff-shuffle) (list 1 2 3 4 5 6 7 8))", "(1 3 5 7 2 4 6 8)");
	TEST("(riff-shuffle (riff-shuffle (riff-shuffle (list 1 2 3 4 5 6 7 8))))", "(1 2 3 4 5 6 7 8)");
	std::cout
		<< "total tests " << g_test_count
		<< ", total failures " << g_fault_count
		<< "\n";
	return g_fault_count ? EXIT_FAILURE : EXIT_SUCCESS;
}